

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteInt32
               (int field_number,int32 value,CodedOutputStream *output)

{
  uint32 value_00;
  CodedOutputStream *output_local;
  int32 value_local;
  int field_number_local;
  
  value_00 = MakeTag(field_number,WIRETYPE_VARINT);
  io::CodedOutputStream::WriteTag(output,value_00);
  io::CodedOutputStream::WriteVarint32SignExtended(output,value);
  return;
}

Assistant:

void WireFormatLite::WriteInt32(int field_number, int32 value,
                                io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteInt32NoTag(value, output);
}